

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O0

string * __thiscall
helics::MessageFederateManager::localQuery_abi_cxx11_
          (MessageFederateManager *this,string_view queryStr)

{
  bool bVar1;
  char *in_RSI;
  string *in_RDI;
  string *ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> in_stack_ffffffffffffff78;
  basic_string_view<char,_std::char_traits<char>_> in_stack_ffffffffffffff88;
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  
  std::__cxx11::string::string(in_stack_ffffffffffffff70);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff70,in_RSI);
  bVar1 = std::operator==(in_stack_ffffffffffffff88,in_stack_ffffffffffffff78);
  if (bVar1) {
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
    ::lock_shared(in_stack_ffffffffffffff98);
    generateStringVector_if<gmlc::libguarded::shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,helics::InterfaceHandle,(reference_stability)0,5>,std::shared_mutex>,helics::MessageFederateManager::localQuery[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)const::__0,helics::MessageFederateManager::localQuery[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)const::__1>
              (&stack0xffffffffffffff98,&stack0xffffffffffffff80);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::__cxx11::string::~string(in_RDI);
    gmlc::libguarded::
    shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
    ::~shared_lock_handle
              ((shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
                *)0x27eb3b);
  }
  return in_RDI;
}

Assistant:

std::string MessageFederateManager::localQuery(std::string_view queryStr) const
{
    std::string ret;
    if (queryStr == "endpoints") {
        ret = generateStringVector_if(
            mLocalEndpoints.lock_shared(),
            [](const auto& info) { return info.getName(); },
            [](const auto& info) { return (!info.getName().empty()); });
    }
    return ret;
}